

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalKdevelopGenerator::Generate(cmGlobalKdevelopGenerator *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *pmVar3;
  pointer ppVar4;
  const_reference ppcVar5;
  char *pcVar6;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_00;
  reference ppcVar7;
  reference ppcVar8;
  ulong uVar9;
  allocator local_161;
  string local_160;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_140;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_138;
  const_iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_120;
  const_iterator lg;
  string executable;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs;
  string fileToOpen;
  undefined1 local_c0 [8];
  string cmakeFilePattern;
  string projectName;
  undefined1 local_78 [8];
  string projectDir;
  allocator local_41;
  undefined1 local_40 [8];
  string outputDir;
  _Self local_18;
  const_iterator it;
  cmGlobalKdevelopGenerator *this_local;
  
  it._M_node = (_Base_ptr)this;
  pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
       ::begin(pmVar3);
  do {
    pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    outputDir.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
         ::end(pmVar3);
    bVar1 = std::operator!=(&local_18,(_Self *)((long)&outputDir.field_2 + 8));
    if (!bVar1) {
      return;
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_18);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_40,pcVar6,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_18);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    pcVar6 = cmLocalGenerator::GetSourceDirectory(*ppcVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_78,pcVar6,(allocator *)(projectName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(projectName.field_2._M_local_buf + 0xf));
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_18);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)((long)&cmakeFilePattern.field_2 + 8),*ppcVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c0,"CMakeLists.txt;*.cmake;",
               (allocator *)(fileToOpen.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(fileToOpen.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&lgs);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_18);
    lgs_00 = &ppVar4->second;
    bVar1 = CreateFilelistFile(this,lgs_00,(string *)local_40,(string *)local_78,
                               (string *)((long)&cmakeFilePattern.field_2 + 8),(string *)local_c0,
                               (string *)&lgs);
    if (bVar1) {
      std::__cxx11::string::string((string *)&lg);
      local_120._M_current =
           (cmLocalGenerator **)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs_00);
      while( true ) {
        targets = (vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs_00);
        bVar1 = __gnu_cxx::operator!=
                          (&local_120,
                           (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                            *)&targets);
        if (!bVar1) break;
        ppcVar7 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_120);
        ti._M_current = (cmGeneratorTarget **)cmLocalGenerator::GetGeneratorTargets(*ppcVar7);
        local_138._M_current =
             (cmGeneratorTarget **)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                       ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                        ti._M_current);
        while( true ) {
          local_140._M_current =
               (cmGeneratorTarget **)
               std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                         (ti._M_current);
          bVar1 = __gnu_cxx::operator!=(&local_138,&local_140);
          if (!bVar1) break;
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_138);
          TVar2 = cmGeneratorTarget::GetType(*ppcVar8);
          if (TVar2 == EXECUTABLE) {
            ppcVar8 = __gnu_cxx::
                      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                      ::operator*(&local_138);
            this_00 = *ppcVar8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_160,"",&local_161);
            pcVar6 = cmGeneratorTarget::GetLocation(this_00,&local_160);
            std::__cxx11::string::operator=((string *)&lg,pcVar6);
            std::__cxx11::string::~string((string *)&local_160);
            std::allocator<char>::~allocator((allocator<char> *)&local_161);
            break;
          }
          __gnu_cxx::
          __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
          ::operator++(&local_138,0);
        }
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&local_120,0);
      }
      CreateProjectFile(this,(string *)local_40,(string *)local_78,
                        (string *)((long)&cmakeFilePattern.field_2 + 8),(string *)&lg,
                        (string *)local_c0,(string *)&lgs);
      std::__cxx11::string::~string((string *)&lg);
      bVar1 = false;
    }
    else {
      cmSystemTools::Error("Can not create filelist file",(char *)0x0,(char *)0x0,(char *)0x0);
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)&lgs);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)(cmakeFilePattern.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_40);
    if (bVar1) {
      return;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&local_18);
  } while( true );
}

Assistant:

void cmGlobalKdevelopGenerator::Generate()
{
  // for each sub project in the project create
  // a kdevelop project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    std::string outputDir=it->second[0]->GetCurrentBinaryDirectory();
    std::string projectDir=it->second[0]->GetSourceDirectory();
    std::string projectName=it->second[0]->GetProjectName();
    std::string cmakeFilePattern("CMakeLists.txt;*.cmake;");
    std::string fileToOpen;
    const std::vector<cmLocalGenerator*>& lgs= it->second;
    // create the project.kdevelop.filelist file
    if(!this->CreateFilelistFile(lgs, outputDir, projectDir,
                                 projectName, cmakeFilePattern, fileToOpen))
      {
      cmSystemTools::Error("Can not create filelist file");
      return;
      }
    //try to find the name of an executable so we have something to
    //run from kdevelop for now just pick the first executable found
    std::string executable;
    for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
         lg!=lgs.end(); lg++)
      {
      std::vector<cmGeneratorTarget*> const& targets =
          (*lg)->GetGeneratorTargets();
      for (std::vector<cmGeneratorTarget*>::const_iterator ti =
           targets.begin(); ti != targets.end(); ti++)
        {
        if ((*ti)->GetType()==cmState::EXECUTABLE)
          {
          executable = (*ti)->GetLocation("");
          break;
          }
        }
      if (!executable.empty())
        {
        break;
        }
      }

    // now create a project file
    this->CreateProjectFile(outputDir, projectDir, projectName,
                            executable, cmakeFilePattern, fileToOpen);
    }
}